

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindIssueData
          (UnblindParameter *__return_storage_ptr__,Privkey *blinding_key,ByteData *rangeproof,
          ConfidentialValue *value_commitment,Script *extra,ConfidentialAssetId *asset)

{
  allocator<unsigned_char> *paVar1;
  pointer *this;
  bool bVar2;
  uchar *puVar3;
  size_type sVar4;
  uchar *puVar5;
  size_type sVar6;
  uchar *puVar7;
  size_type sVar8;
  CfdException *pCVar9;
  uchar *extra_00;
  size_type extra_len;
  uchar *generator_00;
  size_type generator_len;
  uchar *asset_out_00;
  size_type asset_out_len;
  uchar *abf_out_00;
  size_type abf_out_len;
  uchar *vbf_out_00;
  size_type vbf_out_len;
  Amount AVar10;
  Amount local_378;
  ConfidentialValue local_368;
  ByteData256 local_340;
  BlindFactor local_328;
  ByteData256 local_308;
  BlindFactor local_2f0;
  ByteData local_2d0;
  ConfidentialAssetId local_2b8;
  undefined1 local_28b;
  undefined1 local_28a;
  allocator local_289;
  string local_288;
  CfdSourceLocation local_268;
  uint64_t local_250;
  uint64_t value_out;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  string local_1e0;
  CfdSourceLocation local_1c0;
  allocator<unsigned_char> local_1a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  undefined1 local_170 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  int ret;
  ConfidentialAssetId *asset_local;
  Script *extra_local;
  ConfidentialValue *value_commitment_local;
  ByteData *rangeproof_local;
  Privkey *blinding_key_local;
  UnblindParameter *result;
  
  Privkey::GetData(&local_98,blinding_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,&local_98);
  ByteData::~ByteData(&local_98);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &commitment_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,rangeproof);
  ConfidentialValue::GetData
            ((ByteData *)
             &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,value_commitment);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                     (ByteData *)
                     &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_108);
  bVar2 = Script::IsEmpty(extra);
  if (!bVar2) {
    Script::GetData((ByteData *)
                    &empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,extra);
    ByteData::GetBytes(&local_120,
                       (ByteData *)
                       &empty_factor.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_108,&local_120);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
    ByteData::~ByteData((ByteData *)
                        &empty_factor.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  paVar1 = (allocator<unsigned_char> *)
           ((long)&asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<unsigned_char>::allocator(paVar1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_150,0x20,paVar1);
  ::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_150);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  memset(puVar3,0,sVar4);
  ConfidentialAssetId::GetUnblindedData
            ((ByteData *)
             &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
                     (ByteData *)
                     &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<unsigned_char>::allocator(&local_1a1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_1a0,0x21,&local_1a1);
  ::std::allocator<unsigned_char>::~allocator(&local_1a1);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_150);
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1a0);
  sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a0);
  nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       wally_asset_generator_from_bytes(puVar3,sVar4,puVar5,sVar6,puVar7,sVar8);
  if (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    paVar1 = (allocator<unsigned_char> *)
             ((long)&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(paVar1);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,0x20,paVar1);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    paVar1 = (allocator<unsigned_char> *)
             ((long)&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(paVar1);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,0x20,paVar1);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&value_out + 7));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,0x20,
               (allocator<unsigned_char> *)((long)&value_out + 7));
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&value_out + 7));
    local_250 = 0;
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    this = &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    extra_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_108);
    extra_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_108);
    generator_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1a0);
    generator_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a0);
    asset_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
    asset_out_len =
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
    abf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
    abf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
    vbf_out_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
    vbf_out_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
    nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         wally_asset_unblind_with_nonce
                   (puVar3,sVar4,puVar5,sVar6,puVar7,sVar8,extra_00,extra_len,generator_00,
                    generator_len,asset_out_00,asset_out_len,abf_out_00,abf_out_len,vbf_out_00,
                    vbf_out_len,&local_250);
    if (nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      local_28b = 0;
      UnblindParameter::UnblindParameter(__return_storage_ptr__);
      ByteData::ByteData(&local_2d0,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      ConfidentialAssetId::ConfidentialAssetId(&local_2b8,&local_2d0);
      ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_2b8);
      ConfidentialAssetId::~ConfidentialAssetId(&local_2b8);
      ByteData::~ByteData(&local_2d0);
      ByteData256::ByteData256
                (&local_308,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      BlindFactor::BlindFactor(&local_2f0,&local_308);
      BlindFactor::operator=(&__return_storage_ptr__->abf,&local_2f0);
      BlindFactor::~BlindFactor(&local_2f0);
      ByteData256::~ByteData256(&local_308);
      ByteData256::ByteData256
                (&local_340,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      BlindFactor::BlindFactor(&local_328,&local_340);
      BlindFactor::operator=(&__return_storage_ptr__->vbf,&local_328);
      BlindFactor::~BlindFactor(&local_328);
      ByteData256::~ByteData256(&local_340);
      AVar10 = Amount::CreateBySatoshiAmount(local_250);
      local_378.amount_ = AVar10.amount_;
      local_378.ignore_check_ = AVar10.ignore_check_;
      ConfidentialValue::ConfidentialValue(&local_368,&local_378);
      ConfidentialValue::operator=(&__return_storage_ptr__->value,&local_368);
      ConfidentialValue::~ConfidentialValue(&local_368);
      local_28b = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_1a0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_150);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_108);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      return __return_storage_ptr__;
    }
    local_268.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_268.filename = local_268.filename + 1;
    local_268.line = 0xbcd;
    local_268.funcname = "CalculateUnblindIssueData";
    logger::warn<int&>(&local_268,"wally_asset_unblind_with_nonce NG[{}].",
                       (int *)((long)&nonce_bytes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_28a = 1;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_288,"unblind confidential data error.",&local_289);
    CfdException::CfdException(pCVar9,kCfdIllegalStateError,&local_288);
    local_28a = 0;
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_1c0.filename = local_1c0.filename + 1;
  local_1c0.line = 0xbbd;
  local_1c0.funcname = "CalculateUnblindIssueData";
  logger::warn<int&>(&local_1c0,"wally_asset_generator_from_bytes NG[{}].",
                     (int *)((long)&nonce_bytes.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_1e0,"asset generator error.",
             (allocator *)
             ((long)&abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CfdException::CfdException(pCVar9,kCfdIllegalStateError,&local_1e0);
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindIssueData(
    const Privkey &blinding_key, const ByteData &rangeproof,
    const ConfidentialValue &value_commitment, const Script &extra,
    const ConfidentialAssetId &asset) {
  int ret;
  const std::vector<uint8_t> nonce_bytes = blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  std::vector<uint8_t> extra_bytes;
  if (!extra.IsEmpty()) {
    extra_bytes = extra.GetData().GetBytes();
  }

  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  memset(empty_factor.data(), 0, empty_factor.size());
  const std::vector<uint8_t> asset_bytes = asset.GetUnblindedData().GetBytes();
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), empty_factor.data(),
      empty_factor.size(), generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "asset generator error.");
  }

  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  ret = wally_asset_unblind_with_nonce(
      nonce_bytes.data(), nonce_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      generator.data(), generator.size(), asset_out.data(), asset_out.size(),
      abf_out.data(), abf_out.size(), vbf_out.data(), vbf_out.size(),
      &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind_with_nonce NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));
  return result;
}